

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&> *this)

{
  long lVar1;
  long lVar2;
  char16_t *__dest;
  QString *pQVar3;
  char16_t *pcVar4;
  
  lVar1 = (((this->a).a)->d).size;
  lVar2 = (this->b->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar1 + 1 + lVar2,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  pQVar3 = (this->a).a;
  lVar1 = (pQVar3->d).size;
  if (lVar1 != 0) {
    pcVar4 = (pQVar3->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = L"";
    }
    memcpy(__dest,pcVar4,lVar1 * 2);
  }
  __dest[lVar1] = (ushort)(byte)(this->a).b.ch;
  lVar2 = (this->b->d).size;
  if (lVar2 != 0) {
    pcVar4 = (this->b->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = L"";
    }
    memcpy(__dest + lVar1 + 1,pcVar4,lVar2 * 2);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }